

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles2::Functional::BlendCase::iterate(BlendCase *this)

{
  IVec3 *pIVar1;
  TextureFormat TVar2;
  ReferenceQuadRenderer *pRVar3;
  RenderContext *context;
  TestLog *log;
  bool bVar4;
  deUint32 dVar5;
  int iVar6;
  int y;
  GLenum GVar7;
  RenderTarget *pRVar8;
  char *pcVar9;
  IterateResult IVar10;
  uint uVar11;
  qpTestResult testResult;
  pointer pBVar12;
  ConstPixelBufferAccess local_348;
  ConstPixelBufferAccess local_320;
  deUint32 local_2f4;
  Surface referenceImg;
  Surface renderedImg;
  RGBA local_2c0 [4];
  Vector<unsigned_int,_4> local_2b0;
  UVec4 compareThreshold;
  FragmentOperationState referenceState;
  Vector<unsigned_int,_4> local_1f0;
  Vector<unsigned_int,_4> local_1e0;
  Vector<unsigned_int,_4> local_1d0;
  Random rnd;
  PixelBufferAccess nullAccess;
  
  dVar5 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar11 = ((uint)this->m_curParamSetNdx >> 0x10 ^ this->m_curParamSetNdx ^ 0x3d) * 9;
  uVar11 = (uVar11 >> 4 ^ uVar11) * 0x27d4eb2d;
  deRandom_init(&rnd.m_rnd,uVar11 >> 0xf ^ dVar5 ^ uVar11);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = de::Random::getInt((Random *)&rnd.m_rnd,0,pRVar8->m_width - this->m_viewportW);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  y = de::Random::getInt((Random *)&rnd.m_rnd,0,pRVar8->m_height - this->m_viewportH);
  tcu::Surface::Surface(&renderedImg,this->m_viewportW,this->m_viewportH);
  tcu::Surface::Surface(&referenceImg,this->m_viewportH,this->m_viewportH);
  TVar2 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pBVar12 = (this->m_paramSets).
            super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_curParamSetNdx;
  rr::FragmentOperationState::FragmentOperationState(&referenceState);
  pIVar1 = &nullAccess.super_ConstPixelBufferAccess.m_size;
  nullAccess.super_ConstPixelBufferAccess.m_format = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"RGB equation = ");
  pcVar9 = glu::getBlendEquationName(pBVar12->equationRGB);
  std::operator<<((ostream *)pIVar1,pcVar9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&nullAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  pIVar1 = &nullAccess.super_ConstPixelBufferAccess.m_size;
  nullAccess.super_ConstPixelBufferAccess.m_format = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"RGB src func = ");
  pcVar9 = glu::getBlendFactorName(pBVar12->srcFuncRGB);
  std::operator<<((ostream *)pIVar1,pcVar9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&nullAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  pIVar1 = &nullAccess.super_ConstPixelBufferAccess.m_size;
  nullAccess.super_ConstPixelBufferAccess.m_format = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"RGB dst func = ");
  pcVar9 = glu::getBlendFactorName(pBVar12->dstFuncRGB);
  std::operator<<((ostream *)pIVar1,pcVar9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&nullAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  pIVar1 = &nullAccess.super_ConstPixelBufferAccess.m_size;
  nullAccess.super_ConstPixelBufferAccess.m_format = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"Alpha equation = ");
  pcVar9 = glu::getBlendEquationName(pBVar12->equationAlpha);
  std::operator<<((ostream *)pIVar1,pcVar9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&nullAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  pIVar1 = &nullAccess.super_ConstPixelBufferAccess.m_size;
  nullAccess.super_ConstPixelBufferAccess.m_format = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"Alpha src func = ");
  pcVar9 = glu::getBlendFactorName(pBVar12->srcFuncAlpha);
  std::operator<<((ostream *)pIVar1,pcVar9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&nullAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  pIVar1 = &nullAccess.super_ConstPixelBufferAccess.m_size;
  nullAccess.super_ConstPixelBufferAccess.m_format = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"Alpha dst func = ");
  pcVar9 = glu::getBlendFactorName(pBVar12->dstFuncAlpha);
  std::operator<<((ostream *)pIVar1,pcVar9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&nullAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  pIVar1 = &nullAccess.super_ConstPixelBufferAccess.m_size;
  nullAccess.super_ConstPixelBufferAccess.m_format = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"Blend color = (");
  std::ostream::operator<<(pIVar1,(pBVar12->blendColor).m_data[0]);
  std::operator<<((ostream *)pIVar1,", ");
  std::ostream::operator<<(pIVar1,(pBVar12->blendColor).m_data[1]);
  std::operator<<((ostream *)pIVar1,", ");
  std::ostream::operator<<(pIVar1,(pBVar12->blendColor).m_data[2]);
  std::operator<<((ostream *)pIVar1,", ");
  std::ostream::operator<<(pIVar1,(pBVar12->blendColor).m_data[3]);
  std::operator<<((ostream *)pIVar1,")");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&nullAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  glwBlendEquationSeparate(pBVar12->equationRGB,pBVar12->equationAlpha);
  GVar7 = glwGetError();
  glu::checkError(GVar7,"glBlendEquationSeparate(paramSet.equationRGB, paramSet.equationAlpha)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBlendTests.cpp"
                  ,0xe7);
  glwBlendFuncSeparate
            (pBVar12->srcFuncRGB,pBVar12->dstFuncRGB,pBVar12->srcFuncAlpha,pBVar12->dstFuncAlpha);
  GVar7 = glwGetError();
  glu::checkError(GVar7,
                  "glBlendFuncSeparate(paramSet.srcFuncRGB, paramSet.dstFuncRGB, paramSet.srcFuncAlpha, paramSet.dstFuncAlpha)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBlendTests.cpp"
                  ,0xe8);
  glwBlendColor((pBVar12->blendColor).m_data[0],(pBVar12->blendColor).m_data[1],
                (pBVar12->blendColor).m_data[2],(pBVar12->blendColor).m_data[3]);
  GVar7 = glwGetError();
  glu::checkError(GVar7,
                  "glBlendColor(paramSet.blendColor.x(), paramSet.blendColor.y(), paramSet.blendColor.z(), paramSet.blendColor.w())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBlendTests.cpp"
                  ,0xe9);
  referenceState.blendRGBState.equation = sglr::rr_util::mapGLBlendEquation(pBVar12->equationRGB);
  referenceState.blendRGBState.srcFunc = sglr::rr_util::mapGLBlendFunc(pBVar12->srcFuncRGB);
  referenceState.blendRGBState.dstFunc = sglr::rr_util::mapGLBlendFunc(pBVar12->dstFuncRGB);
  referenceState.blendAState.equation = sglr::rr_util::mapGLBlendEquation(pBVar12->equationAlpha);
  referenceState.blendAState.srcFunc = sglr::rr_util::mapGLBlendFunc(pBVar12->srcFuncAlpha);
  referenceState.blendAState.dstFunc = sglr::rr_util::mapGLBlendFunc(pBVar12->dstFuncAlpha);
  referenceState.blendColor.m_data._0_8_ = *(undefined8 *)(pBVar12->blendColor).m_data;
  referenceState.blendColor.m_data._8_8_ = *(undefined8 *)((pBVar12->blendColor).m_data + 2);
  glwDisable(0xbe2);
  glwViewport(iVar6,y,this->m_viewportW,this->m_viewportH);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&this->m_firstQuad);
  glwEnable(0xbe2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&this->m_secondQuad);
  glwFlush();
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&nullAccess.super_ConstPixelBufferAccess);
  referenceState.blendMode = BLENDMODE_NONE;
  pRVar3 = this->m_referenceRenderer;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_320,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess
            ((PixelBufferAccess *)&local_348,(PixelBufferAccess *)&local_320);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar3,(PixelBufferAccess *)&local_348,&nullAccess,&nullAccess,&this->m_firstQuadInt,
             &referenceState);
  referenceState.blendMode = BLENDMODE_STANDARD;
  pRVar3 = this->m_referenceRenderer;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_320,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess
            ((PixelBufferAccess *)&local_348,(PixelBufferAccess *)&local_320);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar3,(PixelBufferAccess *)&local_348,&nullAccess,&nullAccess,&this->m_secondQuadInt,
             &referenceState);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_348,&referenceImg);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_320,this->m_refColorBuffer);
  tcu::copy((EVP_PKEY_CTX *)&local_348,(EVP_PKEY_CTX *)&local_320);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_348,&renderedImg);
  glu::readPixels(context,iVar6,y,(PixelBufferAccess *)&local_348);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_2f4 = (deUint32)tcu::PixelFormat::getColorThreshold(&pRVar8->m_pixelFormat);
  tcu::RGBA::toIVec(local_2c0);
  tcu::Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&local_2b0);
  tcu::Vector<unsigned_int,_4>::Vector(&local_1d0,5);
  tcu::operator*((tcu *)&local_320,&local_2b0,&local_1d0);
  tcu::Vector<unsigned_int,_4>::Vector(&local_1e0,2);
  tcu::operator/((tcu *)&local_348,(Vector<unsigned_int,_4> *)&local_320,&local_1e0);
  tcu::Vector<unsigned_int,_4>::Vector(&local_1f0,3);
  tcu::operator+((tcu *)&compareThreshold,(Vector<unsigned_int,_4> *)&local_348,&local_1f0);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_348,&referenceImg);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_320,&renderedImg);
  bVar4 = tcu::intThresholdCompare
                    (log,"CompareResult","Image Comparison Result",&local_348,&local_320,
                     &compareThreshold,COMPARE_LOG_RESULT);
  if (bVar4) {
    iVar6 = this->m_curParamSetNdx + 1;
    this->m_curParamSetNdx = iVar6;
    if (iVar6 < (int)(((long)(this->m_paramSets).
                             super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_paramSets).
                            super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
      IVar10 = CONTINUE;
      goto LAB_00ec9e36;
    }
    pcVar9 = "Passed";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    pcVar9 = "Image compare failed";
    testResult = QP_TEST_RESULT_FAIL;
  }
  IVar10 = STOP;
  tcu::TestContext::setTestResult(((this->super_TestCase).m_context)->m_testCtx,testResult,pcVar9);
LAB_00ec9e36:
  tcu::Surface::~Surface(&referenceImg);
  tcu::Surface::~Surface(&renderedImg);
  return IVar10;
}

Assistant:

BlendCase::IterateResult BlendCase::iterate (void)
{
	de::Random						rnd				(deStringHash(getName()) ^ deInt32Hash(m_curParamSetNdx));
	int								viewportX		= rnd.getInt(0, m_context.getRenderTarget().getWidth() - m_viewportW);
	int								viewportY		= rnd.getInt(0, m_context.getRenderTarget().getHeight() - m_viewportH);
	tcu::Surface					renderedImg		(m_viewportW, m_viewportH);
	tcu::Surface					referenceImg	(m_viewportH, m_viewportH);
	TestLog&						log				(m_testCtx.getLog());
	const BlendParams&				paramSet		= m_paramSets[m_curParamSetNdx];
	rr::FragmentOperationState		referenceState;

	// Log the blend parameters.

	log << TestLog::Message << "RGB equation = " << getBlendEquationName(paramSet.equationRGB) << TestLog::EndMessage;
	log << TestLog::Message << "RGB src func = " << getBlendFactorName(paramSet.srcFuncRGB) << TestLog::EndMessage;
	log << TestLog::Message << "RGB dst func = " << getBlendFactorName(paramSet.dstFuncRGB) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha equation = " << getBlendEquationName(paramSet.equationAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha src func = " << getBlendFactorName(paramSet.srcFuncAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha dst func = " << getBlendFactorName(paramSet.dstFuncAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Blend color = (" << paramSet.blendColor.x() << ", " << paramSet.blendColor.y() << ", " << paramSet.blendColor.z() << ", " << paramSet.blendColor.w() << ")" << TestLog::EndMessage;

	// Set GL state.

	GLU_CHECK_CALL(glBlendEquationSeparate(paramSet.equationRGB, paramSet.equationAlpha));
	GLU_CHECK_CALL(glBlendFuncSeparate(paramSet.srcFuncRGB, paramSet.dstFuncRGB, paramSet.srcFuncAlpha, paramSet.dstFuncAlpha));
	GLU_CHECK_CALL(glBlendColor(paramSet.blendColor.x(), paramSet.blendColor.y(), paramSet.blendColor.z(), paramSet.blendColor.w()));

	// Set reference state.

	referenceState.blendRGBState.equation	= sglr::rr_util::mapGLBlendEquation(paramSet.equationRGB);
	referenceState.blendRGBState.srcFunc	= sglr::rr_util::mapGLBlendFunc(paramSet.srcFuncRGB);
	referenceState.blendRGBState.dstFunc	= sglr::rr_util::mapGLBlendFunc(paramSet.dstFuncRGB);
	referenceState.blendAState.equation		= sglr::rr_util::mapGLBlendEquation(paramSet.equationAlpha);
	referenceState.blendAState.srcFunc		= sglr::rr_util::mapGLBlendFunc(paramSet.srcFuncAlpha);
	referenceState.blendAState.dstFunc		= sglr::rr_util::mapGLBlendFunc(paramSet.dstFuncAlpha);
	referenceState.blendColor				= paramSet.blendColor;

	// Render with GL.

	glDisable(GL_BLEND);
	glViewport(viewportX, viewportY, m_viewportW, m_viewportH);
	m_renderer->render(m_firstQuad);
	glEnable(GL_BLEND);
	m_renderer->render(m_secondQuad);
	glFlush();

	// Render reference.

	const tcu::PixelBufferAccess nullAccess = tcu::PixelBufferAccess();

	referenceState.blendMode = rr::BLENDMODE_NONE;
	m_referenceRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()), nullAccess /* no depth */, nullAccess /* no stencil */, m_firstQuadInt, referenceState);
	referenceState.blendMode = rr::BLENDMODE_STANDARD;
	m_referenceRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()), nullAccess /* no depth */, nullAccess /* no stencil */, m_secondQuadInt, referenceState);

	// Expand reference color buffer to RGBA8
	copy(referenceImg.getAccess(), m_refColorBuffer->getAccess());

	// Read GL image.

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	// Compare images.

	UVec4 compareThreshold = m_context.getRenderTarget().getPixelFormat().getColorThreshold().toIVec().asUint()
							 * UVec4(5) / UVec4(2) + UVec4(3); // \note Non-scientific ad hoc formula. Need big threshold when few color bits; blending brings extra inaccuracy.

	bool comparePass = tcu::intThresholdCompare(m_testCtx.getLog(), "CompareResult", "Image Comparison Result", referenceImg.getAccess(), renderedImg.getAccess(), compareThreshold, tcu::COMPARE_LOG_RESULT);

	// Fail now if images don't match.

	if (!comparePass)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");
		return STOP;
	}

	// Continue if param sets still remain in m_paramSets; otherwise stop.

	m_curParamSetNdx++;

	if (m_curParamSetNdx < (int)m_paramSets.size())
		return CONTINUE;
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Passed");
		return STOP;
	}
}